

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

class_<kratos::DebugDatabase> * __thiscall
pybind11::class_<kratos::DebugDatabase>::
def<void(kratos::DebugDatabase::*)(kratos::Generator*),pybind11::arg>
          (class_<kratos::DebugDatabase> *this,char *name_,offset_in_Var_to_subr *f,arg *extra)

{
  offset_in_Var_to_subr f_00;
  name *extra_00;
  handle local_78;
  PyObject *local_70;
  handle local_68;
  handle local_60;
  undefined1 local_58 [16];
  is_method local_48;
  void *local_40;
  offset_in_Var_to_subr local_38;
  cpp_function local_30;
  cpp_function cf;
  arg *extra_local;
  offset_in_Var_to_subr *f_local;
  char *name__local;
  class_<kratos::DebugDatabase> *this_local;
  
  local_40 = (void *)*f;
  local_38 = f[1];
  cf.super_function.super_object.super_handle.m_ptr = (function)(function)extra;
  f_00 = _kratos__DebugDatabase___pybind11__method_adaptor<kratos::DebugDatabase,void,kratos::DebugDatabase,kratos::Generator*>_void_kratos__DebugDatabase_____kratos__Generator____
                   (local_40,local_38);
  pybind11::name::name((name *)&local_48,name_);
  is_method::is_method((is_method *)(local_58 + 8),(handle *)this);
  local_68.m_ptr = (this->super_generic_type).super_object.super_handle.m_ptr;
  none::none((none *)&local_78);
  local_70 = local_78.m_ptr;
  getattr((pybind11 *)&local_60,local_68,name_,local_78);
  sibling::sibling((sibling *)local_58,&local_60);
  cpp_function::
  cpp_function<void,kratos::DebugDatabase,kratos::Generator*,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::arg>
            (&local_30,f_00,extra_00,&local_48,(sibling *)(local_58 + 8),(arg *)local_58);
  object::~object((object *)&local_60);
  none::~none((none *)&local_78);
  pybind11::detail::add_class_method((object *)this,name_,&local_30);
  cpp_function::~cpp_function(&local_30);
  return this;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        add_class_method(*this, name_, cf);
        return *this;
    }